

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

void vsnapshot_tilde_dsp(t_vsnapshot *x,t_signal **sp)

{
  int iVar1;
  t_sample *ptVar2;
  t_signal *ptVar3;
  
  ptVar3 = *sp;
  iVar1 = ptVar3->s_n;
  if (iVar1 != x->x_n) {
    if (x->x_vec != (t_sample *)0x0) {
      freebytes(x->x_vec,(long)x->x_n << 2);
    }
    ptVar2 = (t_sample *)getbytes((long)iVar1 << 2);
    x->x_vec = ptVar2;
    x->x_gotone = 0;
    x->x_n = iVar1;
    ptVar3 = *sp;
  }
  x->x_sampspermsec = ptVar3->s_sr / 1000.0;
  dsp_add(vsnapshot_tilde_perform,2,ptVar3->s_vec,x);
  return;
}

Assistant:

static void vsnapshot_tilde_dsp(t_vsnapshot *x, t_signal **sp)
{
    int n = sp[0]->s_n;
    if (n != x->x_n)
    {
        if (x->x_vec)
            t_freebytes(x->x_vec, x->x_n * sizeof(t_sample));
        x->x_vec = (t_sample *)getbytes(n * sizeof(t_sample));
        x->x_gotone = 0;
        x->x_n = n;
    }
    x->x_sampspermsec = sp[0]->s_sr / 1000;
    dsp_add(vsnapshot_tilde_perform, 2, sp[0]->s_vec, x);
}